

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aom_integer_test.cc
# Opt level: O1

void __thiscall AomLeb128_EncodeDecodeTest_Test::TestBody(AomLeb128_EncodeDecodeTest_Test *this)

{
  undefined8 *puVar1;
  SEARCH_METHODS *pSVar2;
  uint64_t decoded_value;
  size_t decoded_length;
  AssertionResult gtest_ar;
  size_t bytes_written;
  uint8_t write_buffer [4];
  uint32_t value;
  Message local_50;
  AssertHelper local_48;
  Message local_40;
  internal local_38 [8];
  undefined8 *local_30;
  AssertHelper local_28;
  size_t local_20;
  uint8_t local_18 [4];
  uint local_14;
  
  local_14 = 0x98765;
  local_18[0] = '\0';
  local_18[1] = '\0';
  local_18[2] = '\0';
  local_18[3] = '\0';
  local_20 = 0;
  local_50.ss_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._0_4_ = aom_uleb_encode(0x98765,4,local_18,&local_20);
  local_48.data_._0_4_ = 0;
  testing::internal::CmpHelperEQ<int,int>
            (local_38,"aom_uleb_encode(value, kWriteBufferSize, &write_buffer[0], &bytes_written)",
             "0",(int *)&local_50,(int *)&local_48);
  puVar1 = local_30;
  if (local_38[0] == (internal)0x0) {
    testing::Message::Message(&local_50);
    if (local_30 == (undefined8 *)0x0) {
      pSVar2 = "";
    }
    else {
      pSVar2 = (SEARCH_METHODS *)*local_30;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_48,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/aom_integer_test.cc"
               ,0x47,(char *)pSVar2);
    testing::internal::AssertHelper::operator=(&local_48,&local_50);
LAB_0045a34a:
    testing::internal::AssertHelper::~AssertHelper(&local_48);
    local_40.ss_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl =
         (unique_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )CONCAT44(local_50.ss_._M_t.
                    super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    .
                    super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                    ._M_head_impl._4_4_,
                    (int)local_50.ss_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl);
  }
  else {
    if (local_30 != (undefined8 *)0x0) {
      if ((undefined8 *)*local_30 != local_30 + 2) {
        operator_delete((undefined8 *)*local_30);
      }
      operator_delete(puVar1);
    }
    local_50.ss_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl._0_4_ = 3;
    testing::internal::CmpHelperEQ<unsigned_long,unsigned_int>
              (local_38,"bytes_written","3u",&local_20,(uint *)&local_50);
    puVar1 = local_30;
    if (local_38[0] == (internal)0x0) {
      testing::Message::Message(&local_50);
      if (local_30 == (undefined8 *)0x0) {
        pSVar2 = "";
      }
      else {
        pSVar2 = (SEARCH_METHODS *)*local_30;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_48,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/aom_integer_test.cc"
                 ,0x48,(char *)pSVar2);
      testing::internal::AssertHelper::operator=(&local_48,&local_50);
      goto LAB_0045a34a;
    }
    if (local_30 != (undefined8 *)0x0) {
      if ((undefined8 *)*local_30 != local_30 + 2) {
        operator_delete((undefined8 *)*local_30);
      }
      operator_delete(puVar1);
    }
    aom_uleb_decode(local_18,local_20,(uint64_t *)&local_50,(size_t *)&local_48);
    testing::internal::CmpHelperEQ<unsigned_int,unsigned_long>
              (local_38,"value","decoded_value",&local_14,(unsigned_long *)&local_50);
    puVar1 = local_30;
    if (local_38[0] == (internal)0x0) {
      testing::Message::Message(&local_40);
      if (local_30 == (undefined8 *)0x0) {
        pSVar2 = "";
      }
      else {
        pSVar2 = (SEARCH_METHODS *)*local_30;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_28,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/aom_integer_test.cc"
                 ,0x4d,(char *)pSVar2);
      testing::internal::AssertHelper::operator=(&local_28,&local_40);
    }
    else {
      if (local_30 != (undefined8 *)0x0) {
        if ((undefined8 *)*local_30 != local_30 + 2) {
          operator_delete((undefined8 *)*local_30);
        }
        operator_delete(puVar1);
      }
      testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
                (local_38,"bytes_written","decoded_length",&local_20,(unsigned_long *)&local_48);
      if (local_38[0] != (internal)0x0) goto LAB_0045a364;
      testing::Message::Message(&local_40);
      if (local_30 == (undefined8 *)0x0) {
        pSVar2 = "";
      }
      else {
        pSVar2 = (SEARCH_METHODS *)*local_30;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_28,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/aom_integer_test.cc"
                 ,0x4e,(char *)pSVar2);
      testing::internal::AssertHelper::operator=(&local_28,&local_40);
    }
    testing::internal::AssertHelper::~AssertHelper(&local_28);
  }
  if (local_40.ss_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl !=
      (__uniq_ptr_data<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
       )0x0) {
    (**(code **)(*(long *)local_40.ss_._M_t.
                          super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          .
                          super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                          ._M_head_impl + 8))();
  }
LAB_0045a364:
  if (local_30 != (undefined8 *)0x0) {
    if ((undefined8 *)*local_30 != local_30 + 2) {
      operator_delete((undefined8 *)*local_30);
    }
    operator_delete(local_30);
  }
  return;
}

Assistant:

TEST(AomLeb128, EncodeDecodeTest) {
  const uint32_t value = 0x98765;  // 624485
  const size_t kWriteBufferSize = 4;
  uint8_t write_buffer[kWriteBufferSize] = { 0 };
  size_t bytes_written = 0;
  ASSERT_EQ(aom_uleb_encode(value, kWriteBufferSize, &write_buffer[0],
                            &bytes_written),
            0);
  ASSERT_EQ(bytes_written, 3u);
  uint64_t decoded_value;
  size_t decoded_length;
  aom_uleb_decode(&write_buffer[0], bytes_written, &decoded_value,
                  &decoded_length);
  ASSERT_EQ(value, decoded_value);
  ASSERT_EQ(bytes_written, decoded_length);
}